

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O0

void bmp24toimage(OPJ_UINT8 *pData,OPJ_UINT32 stride,opj_image_t *image)

{
  uint uVar1;
  uint uVar2;
  OPJ_UINT8 *local_40;
  OPJ_UINT8 *pSrc;
  uint local_30;
  OPJ_UINT32 y;
  OPJ_UINT32 x;
  OPJ_UINT32 height;
  OPJ_UINT32 width;
  int index;
  opj_image_t *image_local;
  OPJ_UINT32 stride_local;
  OPJ_UINT8 *pData_local;
  
  uVar1 = image->comps->w;
  uVar2 = image->comps->h;
  height = 0;
  local_40 = pData + (uVar2 - 1) * stride;
  for (pSrc._4_4_ = 0; pSrc._4_4_ < uVar2; pSrc._4_4_ = pSrc._4_4_ + 1) {
    for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
      image->comps->data[(int)height] = (uint)local_40[local_30 * 3 + 2];
      image->comps[1].data[(int)height] = (uint)local_40[local_30 * 3 + 1];
      image->comps[2].data[(int)height] = (uint)local_40[local_30 * 3];
      height = height + 1;
    }
    local_40 = local_40 + -(ulong)stride;
  }
  return;
}

Assistant:

static void bmp24toimage(const OPJ_UINT8* pData, OPJ_UINT32 stride,
                         opj_image_t* image)
{
    int index;
    OPJ_UINT32 width, height;
    OPJ_UINT32 x, y;
    const OPJ_UINT8 *pSrc = NULL;

    width  = image->comps[0].w;
    height = image->comps[0].h;

    index = 0;
    pSrc = pData + (height - 1U) * stride;
    for (y = 0; y < height; y++) {
        for (x = 0; x < width; x++) {
            image->comps[0].data[index] = (OPJ_INT32)pSrc[3 * x + 2]; /* R */
            image->comps[1].data[index] = (OPJ_INT32)pSrc[3 * x + 1]; /* G */
            image->comps[2].data[index] = (OPJ_INT32)pSrc[3 * x + 0]; /* B */
            index++;
        }
        pSrc -= stride;
    }
}